

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_error_code_e
ktxTexture2_CreateFromMemory
          (ktx_uint8_t *bytes,ktx_size_t size,ktxTextureCreateFlags createFlags,ktxTexture2 **newTex
          )

{
  void *__ptr;
  undefined8 *in_RCX;
  ktxTexture2 *tex;
  ktx_error_code_e result;
  ktxTextureCreateFlags in_stack_00000034;
  ktx_size_t in_stack_00000038;
  ktx_uint8_t *in_stack_00000040;
  ktxTexture2 *in_stack_00000048;
  undefined4 local_4;
  
  if (in_RCX == (undefined8 *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    __ptr = malloc(0xa8);
    if (__ptr == (void *)0x0) {
      local_4 = KTX_OUT_OF_MEMORY;
    }
    else {
      local_4 = ktxTexture2_constructFromMemory
                          (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000034);
      if (local_4 == KTX_SUCCESS) {
        *in_RCX = __ptr;
      }
      else {
        free(__ptr);
        *in_RCX = 0;
      }
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture2_CreateFromMemory(const ktx_uint8_t* bytes, ktx_size_t size,
                             ktxTextureCreateFlags createFlags,
                             ktxTexture2** newTex)
{
    KTX_error_code result;
    if (newTex == NULL)
        return KTX_INVALID_VALUE;

    ktxTexture2* tex = (ktxTexture2*)malloc(sizeof(ktxTexture2));
    if (tex == NULL)
        return KTX_OUT_OF_MEMORY;

    result = ktxTexture2_constructFromMemory(tex, bytes, size,
                                             createFlags);
    if (result == KTX_SUCCESS)
        *newTex = (ktxTexture2*)tex;
    else {
        free(tex);
        *newTex = NULL;
    }
    return result;
}